

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DylibBundler.cpp
# Opt level: O2

void collectRpaths(string *filename)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  mapped_type *this;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  string output;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lc_lines;
  string cmd;
  string rpath;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  value_type local_70;
  string local_50 [32];
  
  bVar2 = fileExists(filename);
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,
                             "\n/!\\ WARNING : can\'t collect rpaths for nonexistent file \'");
    poVar5 = std::operator<<(poVar5,(string *)filename);
    std::operator<<(poVar5,"\'\n");
    return;
  }
  std::operator+(&bStack_c8,"otool -l \"",filename);
  std::operator+(&local_90,&bStack_c8,"\"");
  std::__cxx11::string::~string((string *)&bStack_c8);
  system_get_output(&bStack_c8,&local_90);
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tokenize(&bStack_c8,"\n",&local_a8);
  uVar6 = 0;
  bVar2 = false;
  while (uVar6 < (ulong)((long)local_a8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_a8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    std::__cxx11::string::string
              (local_50,(string *)
                        (local_a8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar6));
    uVar1 = uVar6 + 1;
    if (bVar2) {
      lVar3 = std::__cxx11::string::find((char *)local_50,0x1182c6);
      lVar4 = std::__cxx11::string::find((char *)local_50,0x1182cc);
      if (lVar3 == -1 || lVar4 == -1) {
        bVar2 = true;
        std::operator<<((ostream *)&std::cerr,"\n/!\\ WARNING: Unexpected LC_RPATH format\n");
        uVar6 = uVar1;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_70,(ulong)local_50);
        this = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::operator[](&rpaths_per_file_abi_cxx11_,filename);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(this,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        bVar2 = false;
        uVar6 = uVar1;
      }
    }
    else {
      lVar3 = std::__cxx11::string::find((char *)local_50,0x1182f9);
      uVar7 = uVar6 + 2;
      bVar2 = lVar3 != -1;
      uVar6 = uVar1;
      if (bVar2) {
        uVar6 = uVar7;
      }
    }
    std::__cxx11::string::~string(local_50);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  std::__cxx11::string::~string((string *)&bStack_c8);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void collectRpaths(const std::string& filename)
{
    if (!fileExists(filename))
    {
        std::cerr << "\n/!\\ WARNING : can't collect rpaths for nonexistent file '" << filename << "'\n";
        return;
    }

    std::string cmd = "otool -l \"" + filename + "\"";
    std::string output = system_get_output(cmd);

    std::vector<std::string> lc_lines;
    tokenize(output, "\n", &lc_lines);

    size_t pos = 0;
    bool read_rpath = false;
    while (pos < lc_lines.size())
    {
        std::string line = lc_lines[pos];
        pos++;

        if (read_rpath)
        {
            size_t start_pos = line.find("path ");
            size_t end_pos = line.find(" (");
            if (start_pos == std::string::npos || end_pos == std::string::npos)
            {
                std::cerr << "\n/!\\ WARNING: Unexpected LC_RPATH format\n";
                continue;
            }
            start_pos += 5;
            std::string rpath = line.substr(start_pos, end_pos - start_pos);
            rpaths_per_file[filename].push_back(rpath);
            read_rpath = false;
            continue;
        }

        if (line.find("LC_RPATH") != std::string::npos)
        {
            read_rpath = true;
            pos++;
        }
    }
}